

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

void cppcms::xss::anon_unknown_8::split_to_parts
               (char *begin,char *end,
               vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
               *tags)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 *puVar3;
  byte bVar4;
  pointer peVar5;
  pointer ppVar6;
  pointer peVar7;
  undefined8 uVar8;
  html_data_type hVar9;
  char *tmp;
  char *pcVar10;
  pointer peVar11;
  byte *pbVar12;
  long lVar13;
  char *pcVar14;
  pointer peVar15;
  pointer peVar16;
  uint uVar17;
  _Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  *this;
  byte *pbVar18;
  byte *pbVar19;
  value_type local_80;
  byte *local_38;
  
  this = (_Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
          *)0x0;
  pcVar10 = begin;
  if (begin != end) {
    do {
      uVar17 = (int)this + (uint)(*pcVar10 == '<');
      this = (_Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              *)(ulong)uVar17;
      pcVar10 = pcVar10 + 1;
    } while (pcVar10 != end);
    this = (_Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            *)(ulong)uVar17;
  }
  peVar5 = (tags->
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           )._M_impl.super__Vector_impl_data._M_start;
  peVar16 = (tags->
            super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  peVar15 = peVar5;
  pcVar10 = end;
  if (peVar16 != peVar5) {
    do {
      ppVar6 = (peVar15->tag).properties.
               super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ppVar6 != (pointer)0x0) {
        operator_delete(ppVar6);
      }
      peVar15 = peVar15 + 1;
    } while (peVar15 != peVar16);
    (tags->
    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    )._M_impl.super__Vector_impl_data._M_finish = peVar5;
    peVar15 = (tags->
              super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  if ((_Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
       *)(((long)(tags->
                 super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)peVar15 >> 3) *
         -0x71c71c71c71c71c7) < this) {
    peVar11 = std::
              _Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              ::_M_allocate(this,(size_t)pcVar10);
    peVar16 = (tags->
              super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    peVar7 = (tags->
             super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (peVar16 != peVar7) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)&peVar16->begin + lVar13);
        *(undefined4 *)((long)&peVar11->type + lVar13) = *(undefined4 *)(puVar1 + 2);
        uVar8 = puVar1[1];
        puVar3 = (undefined8 *)((long)&peVar11->begin + lVar13);
        *puVar3 = *puVar1;
        puVar3[1] = uVar8;
        uVar8 = puVar1[4];
        puVar3 = (undefined8 *)((long)&(peVar11->tag).tag_begin + lVar13);
        *puVar3 = puVar1[3];
        puVar3[1] = uVar8;
        *(undefined4 *)((long)&(peVar11->tag).pair + lVar13) = *(undefined4 *)(puVar1 + 5);
        uVar8 = puVar1[7];
        puVar3 = (undefined8 *)
                 ((long)&(peVar11->tag).properties.
                         super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar13);
        *puVar3 = puVar1[6];
        puVar3[1] = uVar8;
        *(undefined8 *)
         ((long)&(peVar11->tag).properties.
                 super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar13) = puVar1[8];
        puVar1[6] = 0;
        puVar1[7] = 0;
        puVar1[8] = 0;
        lVar13 = lVar13 + 0x48;
      } while ((pointer)(puVar1 + 9) != peVar7);
      peVar16 = (tags->
                super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    if (peVar16 != (pointer)0x0) {
      operator_delete(peVar16);
    }
    (tags->
    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    )._M_impl.super__Vector_impl_data._M_start = peVar11;
    (tags->
    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(((long)peVar5 - (long)peVar15) + (long)peVar11);
    (tags->
    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = peVar11 + (long)this;
  }
  if (begin != end) {
    local_38 = (byte *)(end + -1);
    do {
      bVar4 = *begin;
      local_80.begin = begin;
      if (bVar4 == 0x3e) {
        pbVar12 = (byte *)begin + 1;
        local_80.type = invalid_data;
        local_80.tag.tag_begin = (char *)0x0;
        local_80.tag.tag_end = (char *)0x0;
        local_80.tag.pair = -1;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_80.end = (char *)pbVar12;
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back(tags,&local_80);
        begin = (char *)pbVar12;
        if (local_80.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.tag.properties.
                          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        local_80.end = end;
        if (bVar4 == 0x3c) {
          pbVar12 = (byte *)begin + 4;
          if ((((pbVar12 < end) && (((byte *)begin)[1] == 0x21)) && (((byte *)begin)[2] == 0x2d)) &&
             (((byte *)begin)[3] == 0x2d)) {
            pcVar14 = (char *)0x4;
            pcVar10 = pcVar14;
            if (pbVar12 < local_38) {
              do {
                if ((((byte *)begin)[(long)pcVar14] == 0x2d) &&
                   (pcVar10 = pcVar14, ((byte *)begin + 1)[(long)pcVar14] == 0x2d)) break;
                pcVar2 = pcVar14 + ((long)begin - (long)end);
                pcVar14 = pcVar14 + 1;
                pcVar10 = end + ~(ulong)begin;
              } while (pcVar2 != (char *)0xfffffffffffffffe);
            }
            if ((end <= pcVar10 + (long)begin + 2) || ((pcVar10 + (long)begin)[2] != '>')) {
              local_80.type = invalid_data;
              local_80.tag.tag_begin = (char *)0x0;
              local_80.tag.tag_end = (char *)0x0;
              local_80.tag.pair = -1;
              local_80.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_80.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_80.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              ::push_back(tags,&local_80);
LAB_0021eea9:
              if (local_80.tag.properties.
                  super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                  ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                return;
              }
              operator_delete(local_80.tag.properties.
                              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              return;
            }
            local_80.type = html_comment;
            if (4 < (long)pcVar10) {
              local_80.type = html_comment;
              do {
                bVar4 = *pbVar12;
                if ((0x3e < (ulong)bVar4) ||
                   (hVar9 = invalid_data, (0x5000004000000000U >> ((ulong)bVar4 & 0x3f) & 1) == 0))
                {
                  hVar9 = local_80.type;
                }
                local_80.type = hVar9;
              } while (((0x3e < bVar4) ||
                       ((0x5000004000000000U >> ((ulong)(uint)bVar4 & 0x3f) & 1) == 0)) &&
                      (pbVar12 = pbVar12 + 1, pbVar12 < pcVar10 + (long)begin));
            }
            pbVar18 = (byte *)(pcVar10 + (long)begin + 3);
            local_80.tag.tag_begin = (char *)0x0;
            local_80.tag.tag_end = (char *)0x0;
            local_80.tag.pair = -1;
            local_80.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_80.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_80.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_80.end = (char *)pbVar18;
            std::
            vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            ::push_back(tags,&local_80);
          }
          else {
            pbVar12 = (byte *)begin + 1;
            do {
              if (pbVar12 == (byte *)end) {
                local_80.type = invalid_data;
                local_80.tag.tag_begin = (char *)0x0;
                local_80.tag.tag_end = (char *)0x0;
                local_80.tag.pair = -1;
                local_80.tag.properties.
                super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_80.tag.properties.
                super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_80.tag.properties.
                super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                ::push_back(tags,&local_80);
                goto LAB_0021eea9;
              }
              pbVar18 = pbVar12 + 1;
              bVar4 = *pbVar12;
              pbVar12 = pbVar18;
            } while (bVar4 != 0x3e);
            local_80.type = html_tag;
            local_80.tag.tag_begin = (char *)0x0;
            local_80.tag.tag_end = (char *)0x0;
            local_80.tag.pair = -1;
            local_80.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_80.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_80.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_80.end = (char *)pbVar18;
            std::
            vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            ::push_back(tags,&local_80);
          }
        }
        else if (bVar4 == 0x26) {
          pbVar12 = (byte *)begin + 1;
          do {
            if (pbVar12 == (byte *)end) {
              local_80.type = invalid_data;
              local_80.tag.tag_begin = (char *)0x0;
              local_80.tag.tag_end = (char *)0x0;
              local_80.tag.pair = -1;
              local_80.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_80.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_80.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              ::push_back(tags,&local_80);
              goto LAB_0021eea9;
            }
            pbVar18 = pbVar12 + 1;
            bVar4 = *pbVar12;
            pbVar12 = pbVar18;
          } while (bVar4 != 0x3b);
          local_80.type = html_entity;
          local_80.tag.tag_begin = (char *)0x0;
          local_80.tag.tag_end = (char *)0x0;
          local_80.tag.pair = -1;
          local_80.tag.properties.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_80.tag.properties.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_80.tag.properties.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_80.end = (char *)pbVar18;
          std::
          vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
          ::push_back(tags,&local_80);
        }
        else {
          pbVar12 = (byte *)begin + 1;
          do {
            pbVar19 = pbVar12;
            pbVar18 = (byte *)end;
            if (pbVar19 == (byte *)end) break;
            pbVar12 = pbVar19 + 1;
          } while ((0x3e < (ulong)*pbVar19) ||
                  (pbVar18 = pbVar19, (0x5000004000000000U >> ((ulong)*pbVar19 & 0x3f) & 1) == 0));
          local_80.type = plain_text;
          local_80.tag.tag_begin = (char *)0x0;
          local_80.tag.tag_end = (char *)0x0;
          local_80.tag.pair = -1;
          local_80.tag.properties.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_80.tag.properties.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_80.tag.properties.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_80.end = (char *)pbVar18;
          std::
          vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
          ::push_back(tags,&local_80);
        }
        begin = (char *)pbVar18;
        if (local_80.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.tag.properties.
                          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    } while (begin != end);
  }
  return;
}

Assistant:

void split_to_parts(char const *begin,char const *end,std::vector<entry> &tags)
		{
			unsigned count = 0;

			for(char const *tmp = begin;tmp!=end;tmp++) {
				if(*tmp == '<')
					count++;
			}
			
			tags.clear();
			tags.reserve(count);

			char const *p=begin;

			while(p!=end) {
				char c=*p;
				switch(c) {
				case '&':
					{
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							if(*e==';')
								break;
						}

						if(e==end) {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}
						else {
							tags.push_back(entry(p,e+1,html_entity));
							p=e+1;
						}
					}
					break;

				case '<':

					if(p+4 < end && p[1]=='!' && p[2]=='-' && p[3]=='-') {
						char const *e =p + 4;
						while(e<end-1) {
							if(e[0]=='-' && e[1]=='-') 
								break;
							e++;
						}
						if(e+2<end && e[2]=='>') {
							
							html_data_type type = html_comment;
							
							for(char const *tmp = p+4;tmp<e;tmp++) {
								char c=*tmp;
								///
								/// Prevent IE conditionals
								///
								if(c=='>' || c=='<' || c=='&') {
									type = invalid_data;
									break;
								}
							}

							tags.push_back(entry(p,e+3,type));
							p=e+3;
						}
						else {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}

					}
					else {
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							if(*e=='>')
								break;
						}
						if(e==end) {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}
						else {
							tags.push_back(entry(p,e+1,html_tag));
							p=e+1;
						}
					}

					break;

				case '>':
					{
						tags.push_back(entry(p,p+1,invalid_data));
						p++;
					}
					break;
				default:
					{
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							char c=*e;
							if(c=='<' || c=='>' || c=='&')
								break;
						}
						tags.push_back(entry(p,e,plain_text));
						p=e;
					}
				} 
			} // while 
		}